

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_decoder.c
# Opt level: O2

lzma_ret delta_decode(lzma_coder_conflict *coder,lzma_allocator *allocator,uint8_t *in,
                     size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                     lzma_action action)

{
  byte bVar1;
  lzma_code_function_conflict p_Var2;
  size_t sVar3;
  anon_enum_32_conflict aVar4;
  lzma_ret lVar5;
  uint8_t uVar6;
  size_t sVar7;
  
  p_Var2 = (coder->next).code;
  if (p_Var2 != (lzma_code_function_conflict)0x0) {
    sVar7 = *out_pos;
    lVar5 = (*p_Var2)((coder->next).coder,allocator,in,in_pos,in_size,out,out_pos,out_size,action);
    sVar3 = *out_pos;
    aVar4 = coder->sequence;
    for (; sVar3 != sVar7; sVar7 = sVar7 + 1) {
      bVar1 = (byte)coder->header_pos;
      uVar6 = out[sVar7] + coder->header[(ulong)((uint)bVar1 + (uint)(byte)(char)aVar4 & 0xff) - 7];
      out[sVar7] = uVar6;
      *(byte *)&coder->header_pos = bVar1 - 1;
      coder->header[(ulong)bVar1 - 7] = uVar6;
    }
    return lVar5;
  }
  __assert_fail("coder->next.code != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/delta/delta_decoder.c"
                ,0x27,
                "lzma_ret delta_decode(lzma_coder *, lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
               );
}

Assistant:

static lzma_ret
delta_decode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size, lzma_action action)
{
	const size_t out_start = *out_pos;
	lzma_ret ret;

	assert(coder->next.code != NULL);

	ret = coder->next.code(coder->next.coder, allocator,
			in, in_pos, in_size, out, out_pos, out_size,
			action);

	decode_buffer(coder, out + out_start, *out_pos - out_start);

	return ret;
}